

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsUniformBlockCase.cpp
# Opt level: O0

void deqp::gls::ub::anon_unknown_12::generateDeclaration(ostringstream *src,UniformBlock *block)

{
  bool bVar1;
  deUint32 dVar2;
  int iVar3;
  ostream *poVar4;
  char *pcVar5;
  reference uniform;
  Indent local_34;
  __normal_iterator<const_deqp::gls::ub::Uniform_*,_std::vector<deqp::gls::ub::Uniform,_std::allocator<deqp::gls::ub::Uniform>_>_>
  local_30;
  __normal_iterator<const_deqp::gls::ub::Uniform_*,_std::vector<deqp::gls::ub::Uniform,_std::allocator<deqp::gls::ub::Uniform>_>_>
  local_28;
  ConstIterator uniformIter;
  UniformBlock *block_local;
  ostringstream *src_local;
  
  dVar2 = UniformBlock::getFlags(block);
  if ((dVar2 & 0xf8) != 0) {
    poVar4 = std::operator<<((ostream *)src,"layout(");
    dVar2 = UniformBlock::getFlags(block);
    LayoutFlagsFmt::LayoutFlagsFmt
              ((LayoutFlagsFmt *)((long)&uniformIter._M_current + 4),dVar2 & 0xf8);
    poVar4 = ub::operator<<(poVar4,(LayoutFlagsFmt *)((long)&uniformIter._M_current + 4));
    std::operator<<(poVar4,") ");
  }
  poVar4 = std::operator<<((ostream *)src,"uniform ");
  pcVar5 = UniformBlock::getBlockName(block);
  std::operator<<(poVar4,pcVar5);
  std::operator<<((ostream *)src,"\n{\n");
  local_28._M_current = (Uniform *)UniformBlock::begin(block);
  while( true ) {
    local_30._M_current = (Uniform *)UniformBlock::end(block);
    bVar1 = __gnu_cxx::operator!=(&local_28,&local_30);
    if (!bVar1) break;
    Indent::Indent(&local_34,1);
    operator<<((ostream *)src,&local_34);
    uniform = __gnu_cxx::
              __normal_iterator<const_deqp::gls::ub::Uniform_*,_std::vector<deqp::gls::ub::Uniform,_std::allocator<deqp::gls::ub::Uniform>_>_>
              ::operator*(&local_28);
    generateDeclaration(src,uniform,1);
    __gnu_cxx::
    __normal_iterator<const_deqp::gls::ub::Uniform_*,_std::vector<deqp::gls::ub::Uniform,_std::allocator<deqp::gls::ub::Uniform>_>_>
    ::operator++(&local_28,0);
  }
  std::operator<<((ostream *)src,"}");
  pcVar5 = UniformBlock::getInstanceName(block);
  if (pcVar5 != (char *)0x0) {
    poVar4 = std::operator<<((ostream *)src," ");
    pcVar5 = UniformBlock::getInstanceName(block);
    std::operator<<(poVar4,pcVar5);
    bVar1 = UniformBlock::isArray(block);
    if (bVar1) {
      poVar4 = std::operator<<((ostream *)src,"[");
      iVar3 = UniformBlock::getArraySize(block);
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar3);
      std::operator<<(poVar4,"]");
    }
  }
  std::operator<<((ostream *)src,";\n");
  return;
}

Assistant:

void generateDeclaration (std::ostringstream& src, const UniformBlock& block)
{
	if ((block.getFlags() & LAYOUT_MASK) != 0)
		src << "layout(" << LayoutFlagsFmt(block.getFlags() & LAYOUT_MASK) << ") ";

	src << "uniform " << block.getBlockName();
	src << "\n{\n";

	for (UniformBlock::ConstIterator uniformIter = block.begin(); uniformIter != block.end(); uniformIter++)
	{
		src << Indent(1);
		generateDeclaration(src, *uniformIter, 1 /* indent level */);
	}

	src << "}";

	if (block.getInstanceName() != DE_NULL)
	{
		src << " " << block.getInstanceName();
		if (block.isArray())
			src << "[" << block.getArraySize() << "]";
	}
	else
		DE_ASSERT(!block.isArray());

	src << ";\n";
}